

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAcurv::NodeIntStateGather
          (ChNodeFEAcurv *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  Index index;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  lVar3 = (x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  if (lVar3 < (long)(ulong)off_x) goto LAB_006592fd;
  pdVar2 = (x->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar4 = 3;
  pdVar1 = pdVar2 + off_x;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_006590b7;
  }
  else {
LAB_006590b7:
    uVar6 = 0;
    do {
      pdVar1[uVar6] = *(double *)((long)(&this->m_ryy + -1) + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] = *(double *)((long)(&this->m_ryy + -1) + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_x + 3)) goto LAB_006592fd;
  pdVar1 = pdVar2 + (off_x + 3);
  uVar4 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_00659123;
  }
  else {
LAB_00659123:
    uVar6 = 0;
    do {
      pdVar1[uVar6] = (this->m_ryy).m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] = (this->m_ryy).m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_x + 6)) goto LAB_006592fd;
  pdVar2 = pdVar2 + (off_x + 6);
  uVar4 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_00659186;
  }
  else {
LAB_00659186:
    uVar6 = 0;
    do {
      pdVar2[uVar6] = (this->m_rzz).m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar2[uVar4] = (this->m_rzz).m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  lVar3 = (v->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  if (lVar3 < (long)(ulong)off_v) goto LAB_006592fd;
  pdVar2 = (v->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar4 = 3;
  pdVar1 = pdVar2 + off_v;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_006591f6;
  }
  else {
LAB_006591f6:
    uVar6 = 0;
    do {
      pdVar1[uVar6] = (this->m_rxx_dt).m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] = (this->m_rxx_dt).m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_v + 3)) goto LAB_006592fd;
  pdVar1 = pdVar2 + (off_v + 3);
  uVar4 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_00659261;
  }
  else {
LAB_00659261:
    uVar6 = 0;
    do {
      pdVar1[uVar6] = (this->m_ryy_dt).m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] = (this->m_ryy_dt).m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_v + 6)) {
LAB_006592fd:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar2 = pdVar2 + (off_v + 6);
  uVar4 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 == 0) goto LAB_006592de;
  }
  uVar6 = 0;
  do {
    pdVar2[uVar6] = (this->m_rzz_dt).m_data[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar4 != uVar6);
LAB_006592de:
  if (uVar4 < 3) {
    do {
      pdVar2[uVar4] = (this->m_rzz_dt).m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  return;
}

Assistant:

void ChNodeFEAcurv::NodeIntStateGather(const unsigned int off_x,
                                       ChState& x,
                                       const unsigned int off_v,
                                       ChStateDelta& v,
                                       double& T) {
    x.segment(off_x + 0, 3) = m_rxx.eigen();
    x.segment(off_x + 3, 3) = m_ryy.eigen();
    x.segment(off_x + 6, 3) = m_rzz.eigen();

    v.segment(off_v + 0, 3) = m_rxx_dt.eigen();
    v.segment(off_v + 3, 3) = m_ryy_dt.eigen();
    v.segment(off_v + 6, 3) = m_rzz_dt.eigen();
}